

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  Arena *pAVar1;
  Arena *pAVar2;
  Arena **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  Message *this_00;
  bool bVar4;
  Message *sub_message_copy;
  Voidify local_89;
  void *local_88;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *sub_arena;
  Arena *arena;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  FieldDescriptor *local_38;
  FieldDescriptor *field_local;
  Message *sub_message_local;
  Message *message_local;
  Reflection *this_local;
  Arena *local_10;
  
  local_51 = 0;
  bVar4 = true;
  local_38 = field;
  field_local = (FieldDescriptor *)sub_message;
  sub_message_local = message;
  message_local = (Message *)this;
  if (sub_message != (Message *)0x0) {
    pAVar1 = MessageLite::GetArena(&sub_message->super_MessageLite);
    bVar4 = true;
    if (pAVar1 != (Arena *)0x0) {
      pAVar1 = MessageLite::GetArena((MessageLite *)field_local);
      pAVar2 = MessageLite::GetArena(&sub_message_local->super_MessageLite);
      bVar4 = pAVar1 == pAVar2;
    }
  }
  if ((bool)(bVar4 ^ 1)) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x9f2,
               "sub_message == nullptr || sub_message->GetArena() == nullptr || sub_message->GetArena() == message->GetArena()"
              );
    local_51 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if (field_local == (FieldDescriptor *)0x0) {
    UnsafeArenaSetAllocatedMessage(this,sub_message_local,(Message *)0x0,local_38);
  }
  else {
    sub_arena = MessageLite::GetArena(&sub_message_local->super_MessageLite);
    absl_log_internal_check_op_result =
         (Nullable<const_char_*>)MessageLite::GetArena((MessageLite *)field_local);
    if (sub_arena == (Arena *)absl_log_internal_check_op_result) {
      UnsafeArenaSetAllocatedMessage(this,sub_message_local,(Message *)field_local,local_38);
    }
    else if ((Arena *)absl_log_internal_check_op_result == (Arena *)0x0) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                     (&sub_arena);
      local_88 = (void *)0x0;
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_88);
      local_80 = absl::lts_20250127::log_internal::
                 Check_NEImpl<google::protobuf::Arena*,decltype(nullptr)>(v1,v2,"arena != nullptr");
      if (local_80 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_80);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&sub_message_copy,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xa04,failure_msg);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&sub_message_copy);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&sub_message_copy);
      }
      local_10 = sub_arena;
      this_local = (Reflection *)field_local;
      if (field_local != (FieldDescriptor *)0x0) {
        internal::ThreadSafeArena::AddCleanup
                  (&sub_arena->impl_,field_local,
                   internal::arena_delete_object<google::protobuf::MessageLite>);
      }
      UnsafeArenaSetAllocatedMessage(this,sub_message_local,(Message *)field_local,local_38);
    }
    else {
      this_00 = MutableMessage(this,sub_message_local,local_38,(MessageFactory *)0x0);
      Message::CopyFrom(this_00,(Message *)field_local);
    }
  }
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  ABSL_DCHECK(sub_message == nullptr || sub_message->GetArena() == nullptr ||
              sub_message->GetArena() == message->GetArena());

  if (sub_message == nullptr) {
    UnsafeArenaSetAllocatedMessage(message, nullptr, field);
    return;
  }

  Arena* arena = message->GetArena();
  Arena* sub_arena = sub_message->GetArena();
  if (arena == sub_arena) {
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    return;
  }

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_arena == nullptr) {
    ABSL_DCHECK_NE(arena, nullptr);
    // Case 1: parent is on an arena and child is heap-allocated. We can add
    // the child to the arena's Own() list to free on arena destruction, then
    // set our pointer.
    arena->Own(sub_message);
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  } else {
    // Case 2: all other cases. We need to make a copy. MutableMessage() will
    // either get the existing message object, or instantiate a new one as
    // appropriate w.r.t. our arena.
    Message* sub_message_copy = MutableMessage(message, field);
    sub_message_copy->CopyFrom(*sub_message);
  }
}